

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNdr.c
# Opt level: O3

Wlc_Ntk_t * Wlc_NtkFromNdr(void *pData)

{
  Wlc_Obj_t *pWVar1;
  Wlc_Obj_t *pWVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  int *piVar7;
  Wlc_Ntk_t *p;
  anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *paVar8;
  ulong uVar9;
  void *pvVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  Abc_Nam_t *pAVar14;
  Wlc_Ntk_t *pWVar15;
  Vec_Wrd_t *pVVar16;
  word *__s;
  int iVar17;
  long lVar18;
  byte bVar19;
  int iVar20;
  int Ent_3;
  uint uVar21;
  long lVar22;
  int Ent_1;
  int iVar23;
  int iVar24;
  int iVar25;
  int *piVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  int Ent;
  uint uVar30;
  uint uVar31;
  bool bVar32;
  int fFound;
  int End;
  uint *local_98;
  int local_84;
  ulong local_80;
  Vec_Int_t *local_78;
  uint local_70;
  int local_6c;
  uint local_68 [7];
  int local_4c;
  ulong local_48;
  Vec_Int_t *local_40;
  Vec_Int_t *local_38;
  
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  piVar7 = (int *)malloc(400);
  pVVar6->pArray = piVar7;
  iVar17 = *(int *)(*(long *)((long)pData + 0x10) + 8) + 2;
  iVar23 = 1;
  local_78 = pVVar6;
  if (3 < iVar17) {
    iVar24 = 3;
    iVar23 = 0;
    do {
      bVar19 = *(byte *)(*(long *)((long)pData + 8) + (long)iVar24);
      if (bVar19 == 0) goto LAB_00344326;
      iVar20 = 1;
      if (bVar19 < 4) {
        iVar20 = *(int *)(*(long *)((long)pData + 0x10) + (long)iVar24 * 4);
      }
      iVar23 = iVar23 + (uint)(bVar19 == 3);
      iVar24 = iVar24 + iVar20;
    } while (iVar24 < iVar17);
    iVar23 = iVar23 + 1;
  }
  p = Wlc_NtkAlloc("top",iVar23);
  Wlc_NtkCheckIntegrity(pData);
  (p->vFfs).nSize = 0;
  uVar31 = p->nObjsAlloc;
  if ((p->vNameIds).nCap < (int)uVar31) {
    piVar7 = (p->vNameIds).pArray;
    if (piVar7 == (int *)0x0) {
      piVar7 = (int *)malloc((long)(int)uVar31 << 2);
    }
    else {
      piVar7 = (int *)realloc(piVar7,(long)(int)uVar31 << 2);
    }
    (p->vNameIds).pArray = piVar7;
    if (piVar7 == (int *)0x0) goto LAB_00343eb4;
    (p->vNameIds).nCap = uVar31;
  }
  if (0 < (int)uVar31) {
    memset((p->vNameIds).pArray,0,(ulong)uVar31 * 4);
  }
  (p->vNameIds).nSize = uVar31;
  lVar11 = *(long *)((long)pData + 0x10);
  if (3 < *(int *)(lVar11 + 8) + 2) {
    local_38 = &p->vFfs;
    lVar18 = *(long *)((long)pData + 8);
    iVar17 = 3;
    do {
      lVar22 = (long)iVar17;
      bVar19 = *(byte *)(lVar18 + lVar22);
      if (bVar19 == 3) {
        iVar24 = iVar17 + 1;
        for (iVar23 = iVar24; iVar23 < *(int *)(lVar11 + lVar22 * 4) + iVar17;
            iVar23 = iVar23 + iVar20) {
          lVar29 = (long)iVar23;
          bVar19 = *(byte *)(lVar18 + lVar29);
          if (bVar19 == 6) {
            if (*(int *)(lVar11 + lVar29 * 4) != 3) goto LAB_00343498;
            break;
          }
          if (bVar19 == 0) goto LAB_00344326;
          iVar20 = 1;
          if (bVar19 < 4) {
            iVar20 = *(int *)(lVar11 + lVar29 * 4);
          }
        }
        iVar23 = Ndr_ObjReadRange((Ndr_Data_t *)pData,iVar17,(int *)local_68,&local_84);
        uVar31 = Wlc_ObjAlloc(p,1,iVar23,local_68[0],local_84);
        lVar11 = *(long *)((long)pData + 0x10);
        iVar20 = *(int *)(lVar11 + lVar22 * 4) + iVar17;
        iVar23 = -1;
        if (iVar24 < iVar20) {
          do {
            lVar18 = (long)iVar24;
            bVar19 = *(byte *)(*(long *)((long)pData + 8) + lVar18);
            if (bVar19 == 5) {
              iVar23 = *(int *)(lVar11 + lVar18 * 4);
              break;
            }
            if (bVar19 == 0) goto LAB_00344326;
            iVar25 = 1;
            if (bVar19 < 4) {
              iVar25 = *(int *)(lVar11 + lVar18 * 4);
            }
            iVar24 = iVar24 + iVar25;
          } while (iVar24 < iVar20);
        }
        if (((int)uVar31 < 0) || ((p->vNameIds).nSize <= (int)uVar31)) goto LAB_00344364;
        (p->vNameIds).pArray[uVar31] = iVar23;
        lVar18 = *(long *)((long)pData + 8);
        bVar19 = *(byte *)(lVar18 + lVar22);
      }
      else if (bVar19 == 0) goto LAB_00344326;
      if (bVar19 == 0) goto LAB_00344326;
      iVar23 = 1;
      if (bVar19 < 4) {
LAB_00343498:
        iVar23 = *(int *)(lVar11 + lVar22 * 4);
      }
      iVar17 = iVar17 + iVar23;
      iVar23 = *(int *)(lVar11 + 8) + 2;
    } while (iVar17 < iVar23);
    if (3 < iVar23) {
      local_40 = &p->vFfs2;
      lVar18 = *(long *)((long)pData + 8);
      iVar17 = 3;
      local_98 = (uint *)0x0;
LAB_003434d4:
      lVar22 = (long)iVar17;
      bVar19 = *(byte *)(lVar18 + lVar22);
      if (bVar19 == 3) {
        iVar20 = *(int *)(lVar11 + lVar22 * 4) + iVar17;
        iVar23 = iVar17 + 1;
        for (iVar24 = iVar23; iVar24 < iVar20; iVar24 = iVar24 + iVar25) {
          lVar29 = (long)iVar24;
          bVar19 = *(byte *)(lVar18 + lVar29);
          if (bVar19 == 6) {
            iVar24 = iVar23;
            if (*(int *)(lVar11 + lVar29 * 4) != 3) goto LAB_00343558;
            break;
          }
          if (bVar19 == 0) goto LAB_00344326;
          iVar25 = 1;
          if (bVar19 < 4) {
            iVar25 = *(int *)(lVar11 + lVar29 * 4);
          }
        }
        goto LAB_00343590;
      }
      if (bVar19 != 0) goto LAB_003434eb;
      goto LAB_00344326;
    }
  }
  local_98 = (uint *)0x0;
  goto LAB_00343e3e;
  while( true ) {
    if (bVar19 == 0) goto LAB_00344326;
    iVar25 = 1;
    if (bVar19 < 4) {
      iVar25 = *(int *)(lVar11 + lVar29 * 4);
    }
    iVar24 = iVar24 + iVar25;
    if (iVar20 <= iVar24) break;
LAB_00343558:
    lVar29 = (long)iVar24;
    bVar19 = *(byte *)(lVar18 + lVar29);
    if (bVar19 == 6) {
      if (*(int *)(lVar11 + lVar29 * 4) != 4) {
        iVar24 = Ndr_ObjReadRange((Ndr_Data_t *)pData,iVar17,(int *)local_68,&local_84);
        lVar11 = *(long *)((long)pData + 0x10);
        iVar20 = *(int *)(lVar11 + lVar22 * 4) + iVar17;
        local_80 = 0xffffffff;
        if (iVar23 < iVar20) {
          iVar25 = iVar23;
          goto LAB_003435e9;
        }
        lVar18 = 0;
        uVar12 = 0xffffffff;
        uVar9 = 0;
        goto LAB_00343689;
      }
      break;
    }
  }
LAB_00343590:
  lVar11 = *(long *)((long)pData + 0x10);
  goto LAB_00343594;
  while( true ) {
    if (bVar19 == 0) goto LAB_00344326;
    iVar27 = 1;
    if (bVar19 < 4) {
      iVar27 = *(int *)(lVar11 + lVar18 * 4);
    }
    iVar25 = iVar25 + iVar27;
    if (iVar20 <= iVar25) break;
LAB_003435e9:
    lVar18 = (long)iVar25;
    bVar19 = *(byte *)(*(long *)((long)pData + 8) + lVar18);
    if (bVar19 == 6) {
      uVar12 = (ulong)*(uint *)(lVar11 + lVar18 * 4);
      goto LAB_0034362f;
    }
  }
  uVar12 = 0xffffffff;
LAB_0034362f:
  lVar18 = 0;
  lVar29 = 0;
  uVar9 = 0;
  iVar25 = iVar23;
  do {
    lVar28 = (long)iVar25;
    bVar19 = *(byte *)(*(long *)((long)pData + 8) + lVar28);
    if (bVar19 == 4) {
      uVar9 = (ulong)((int)uVar9 + 1);
      iVar27 = 1;
      lVar29 = lVar18;
      if (lVar18 == 0) {
        lVar29 = lVar11 + lVar28 * 4;
        lVar18 = lVar29;
      }
    }
    else {
      if (bVar19 == 0) goto LAB_00344326;
      if (lVar29 != 0) break;
      if (bVar19 < 4) {
        iVar27 = *(int *)(lVar11 + lVar28 * 4);
      }
      else {
        iVar27 = 1;
      }
      lVar29 = 0;
    }
    iVar25 = iVar25 + iVar27;
  } while (iVar25 < iVar20);
LAB_00343689:
  local_48 = uVar12;
  iVar20 = Ndr_TypeNdr2Wlc((int)uVar12);
  local_70 = local_68[0];
  local_6c = local_84;
  uVar31 = Wlc_ObjAlloc(p,iVar20,iVar24,local_68[0],local_84);
  lVar11 = *(long *)((long)pData + 0x10);
  iVar24 = *(int *)(lVar11 + lVar22 * 4) + iVar17;
  local_4c = iVar23;
  if (iVar23 < iVar24) {
    do {
      lVar29 = (long)iVar23;
      bVar19 = *(byte *)(*(long *)((long)pData + 8) + lVar29);
      if (bVar19 == 5) {
        local_80 = (ulong)*(uint *)(lVar11 + lVar29 * 4);
        break;
      }
      if (bVar19 == 0) goto LAB_00344326;
      iVar20 = 1;
      if (bVar19 < 4) {
        iVar20 = *(int *)(lVar11 + lVar29 * 4);
      }
      iVar23 = iVar23 + iVar20;
    } while (iVar23 < iVar24);
  }
  local_78->nSize = 0;
  if (0 < (int)uVar9) {
    uVar12 = 0;
    do {
      Vec_IntPush(local_78,*(int *)(lVar18 + uVar12 * 4));
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
  }
  iVar24 = local_4c;
  pVVar6 = local_78;
  iVar23 = (int)local_48;
  switch(iVar23) {
  case 0x58:
    pVVar6 = p->vInits;
    if (pVVar6 == (Vec_Int_t *)0x0) {
      pVVar6 = (Vec_Int_t *)malloc(0x10);
      pVVar6->nCap = 100;
      pVVar6->nSize = 0;
      piVar7 = (int *)malloc(400);
      pVVar6->pArray = piVar7;
      p->vInits = pVVar6;
    }
    if (local_78->nSize == 2) {
      local_78->nSize = 1;
      iVar23 = local_78->pArray[1];
    }
    else {
      iVar23 = local_6c + ~local_70;
    }
    Vec_IntPush(pVVar6,iVar23);
    pVVar6 = local_38;
    if (((int)uVar31 < 1) || (p->nObjsAlloc <= (int)uVar31)) goto LAB_00344345;
    if ((undefined1  [24])((undefined1  [24])p->pObjs[uVar31] & (undefined1  [24])0x3f) !=
        (undefined1  [24])0x3) {
      __assert_fail("Wlc_ObjType(pObj) == WLC_OBJ_FO",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcNdr.c"
                    ,0x196,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
    }
    if ((p->vNameIds).nSize <= (int)uVar31) goto LAB_00344364;
    (p->vNameIds).pArray[uVar31] = (int)local_80;
    Vec_IntPush(local_38,(int)local_80);
    if (local_78->nSize != 1) {
      __assert_fail("Vec_IntSize(vFanins) == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcNdr.c"
                    ,0x19a,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
    }
    Vec_IntPush(pVVar6,*local_78->pArray);
    goto LAB_00343bca;
  case 0x59:
    Vec_IntPush(local_40,uVar31);
    goto LAB_00343abb;
  case 0x5a:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
    break;
  case 0x5b:
    Vec_IntPush(local_78,local_70);
    Vec_IntPush(pVVar6,local_6c);
    break;
  case 0x61:
    lVar11 = *(long *)((long)pData + 0x10);
    iVar23 = *(int *)(lVar11 + lVar22 * 4) + iVar17;
    if (local_4c < iVar23) {
      do {
        lVar18 = (long)iVar24;
        bVar19 = *(byte *)(*(long *)((long)pData + 8) + lVar18);
        if (bVar19 == 9) {
          pcVar13 = (char *)(lVar11 + lVar18 * 4);
          goto LAB_003439c2;
        }
        if (bVar19 == 0) goto LAB_00344326;
        iVar20 = 1;
        if (bVar19 < 4) {
          iVar20 = *(int *)(lVar11 + lVar18 * 4);
        }
        iVar24 = iVar24 + iVar20;
      } while (iVar24 < iVar23);
    }
    pcVar13 = (char *)0x0;
LAB_003439c2:
    Ndr_ObjReadConstant(local_78,pcVar13);
    break;
  default:
    if (iVar23 == 0x15) {
      if (local_78->nSize == 3) {
        piVar7 = local_78->pArray;
        iVar23 = piVar7[1];
        piVar7[1] = piVar7[2];
        if (local_78->nSize < 3) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        piVar7[2] = iVar23;
      }
    }
    else {
      if (iVar23 != 0x4b) break;
      if (local_98 == (uint *)0x0) {
        local_98 = (uint *)malloc(0x10);
        uVar4 = 1000;
        *local_98 = 1000;
        pvVar10 = calloc(1,8000);
        *(void **)(local_98 + 2) = pvVar10;
        local_98[1] = 1000;
      }
      else {
        uVar4 = local_98[1];
      }
      if (((int)uVar4 <= (int)local_80) && (uVar21 = (int)local_80 * 2, (int)uVar4 < (int)uVar21)) {
        uVar5 = *local_98;
        uVar30 = uVar5 * 2;
        if ((int)uVar30 < (int)uVar21) {
          if ((int)uVar5 < (int)uVar21) {
            if (*(void **)(local_98 + 2) == (void *)0x0) {
              pvVar10 = malloc((long)(int)uVar21 << 3);
            }
            else {
              pvVar10 = realloc(*(void **)(local_98 + 2),(long)(int)uVar21 << 3);
            }
            *(void **)(local_98 + 2) = pvVar10;
            uVar30 = uVar21;
LAB_00343a1c:
            if (pvVar10 == (void *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                            ,0x1e4,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
            }
            *local_98 = uVar30;
            uVar4 = local_98[1];
          }
        }
        else if ((int)uVar5 < (int)uVar21) {
          if (*(void **)(local_98 + 2) == (void *)0x0) {
            pvVar10 = malloc((long)(int)uVar5 << 4);
          }
          else {
            pvVar10 = realloc(*(void **)(local_98 + 2),(long)(int)uVar5 << 4);
          }
          *(void **)(local_98 + 2) = pvVar10;
          goto LAB_00343a1c;
        }
        if ((int)uVar4 < (int)uVar21) {
          memset((void *)((long)(int)uVar4 * 8 + *(long *)(local_98 + 2)),0,
                 (ulong)(~uVar4 + uVar21) * 8 + 8);
        }
        local_98[1] = uVar21;
        uVar4 = uVar21;
      }
      while( true ) {
        lVar11 = (long)iVar24;
        bVar19 = *(byte *)(*(long *)((long)pData + 8) + lVar11);
        if (bVar19 == 9) break;
        if (bVar19 == 0) goto LAB_00344326;
        iVar23 = 1;
        if (bVar19 < 4) {
          iVar23 = *(int *)(*(long *)((long)pData + 0x10) + lVar11 * 4);
        }
        iVar24 = iVar24 + iVar23;
      }
      if (((int)local_80 < 0) || ((int)uVar4 <= (int)local_80)) goto LAB_003443c1;
      *(undefined8 *)(*(long *)(local_98 + 2) + (local_80 & 0xffffffff) * 8) =
           *(undefined8 *)(*(long *)((long)pData + 0x10) + lVar11 * 4);
    }
    goto LAB_00343abb;
  }
LAB_00343abb:
  uVar12 = local_80;
  if (((int)uVar31 < 1) || (p->nObjsAlloc <= (int)uVar31)) goto LAB_00344345;
  Wlc_ObjAddFanins(p,p->pObjs + uVar31,local_78);
  if ((p->vNameIds).nSize <= (int)uVar31) goto LAB_00344364;
  (p->vNameIds).pArray[uVar31] = (int)uVar12;
  if ((int)local_48 == 0x35) {
    if (p->nObjsAlloc <= (int)uVar31) goto LAB_00344345;
    pWVar2 = p->pObjs;
    if (pWVar2[uVar31].nFanins != 2) {
      __assert_fail("Wlc_ObjFaninNum(pObj) == 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcNdr.c"
                    ,0x1b3,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
    }
    pWVar1 = pWVar2 + uVar31;
    if ((*(uint *)pWVar1 & 0x3f | 0x10) == 0x16) {
      paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
    }
    else {
      paVar8 = &pWVar1->field_10;
    }
    uVar31 = paVar8->Fanins[0];
    if (((long)(int)uVar31 < 1) || ((uint)p->nObjsAlloc <= uVar31)) goto LAB_00344345;
    *(byte *)(pWVar2 + (int)uVar31) = *(byte *)(pWVar2 + (int)uVar31) | 0x40;
    if ((*(uint *)pWVar1 & 0x3f | 0x10) == 0x16) {
      paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar1->field_10).pFanins[0];
    }
    else {
      paVar8 = &pWVar1->field_10;
    }
    iVar23 = paVar8->Fanins[1];
    if (((long)iVar23 < 1) || (p->nObjsAlloc <= iVar23)) goto LAB_00344345;
    *(ushort *)(p->pObjs + iVar23) = *(ushort *)(p->pObjs + iVar23) | 0x40;
  }
LAB_00343bca:
  lVar18 = *(long *)((long)pData + 8);
  bVar19 = *(byte *)(lVar18 + lVar22);
LAB_003434eb:
  if (bVar19 == 0) goto LAB_00344326;
  lVar11 = *(long *)((long)pData + 0x10);
  iVar23 = 1;
  if (bVar19 < 4) {
LAB_00343594:
    iVar23 = *(int *)(lVar11 + lVar22 * 4);
  }
  iVar17 = iVar17 + iVar23;
  iVar23 = *(int *)(lVar11 + 8) + 2;
  if (iVar23 <= iVar17) goto LAB_00343be5;
  goto LAB_003434d4;
LAB_00343be5:
  if (3 < iVar23) {
    lVar18 = *(long *)((long)pData + 8);
    iVar17 = 3;
    do {
      lVar22 = (long)iVar17;
      bVar19 = *(byte *)(lVar18 + lVar22);
      if (bVar19 == 3) {
        iVar23 = iVar17 + 1;
        for (iVar24 = iVar23; iVar24 < *(int *)(lVar11 + lVar22 * 4) + iVar17;
            iVar24 = iVar24 + iVar20) {
          lVar29 = (long)iVar24;
          bVar19 = *(byte *)(lVar18 + lVar29);
          if (bVar19 == 6) {
            if (*(int *)(lVar11 + lVar29 * 4) != 4) {
              lVar11 = *(long *)((long)pData + 0x10);
              goto LAB_00343e23;
            }
            break;
          }
          if (bVar19 == 0) goto LAB_00344326;
          iVar20 = 1;
          if (bVar19 < 4) {
            iVar20 = *(int *)(lVar11 + lVar29 * 4);
          }
        }
        iVar24 = Ndr_ObjReadRange((Ndr_Data_t *)pData,iVar17,(int *)local_68,&local_84);
        lVar11 = *(long *)((long)pData + 0x10);
        iVar20 = *(int *)(lVar11 + lVar22 * 4) + iVar17;
        uVar31 = 0;
        if (iVar23 < iVar20) {
          piVar7 = (int *)0x0;
          piVar26 = (int *)0x0;
          iVar25 = iVar23;
          do {
            lVar18 = (long)iVar25;
            bVar19 = *(byte *)(*(long *)((long)pData + 8) + lVar18);
            if (bVar19 == 4) {
              uVar31 = uVar31 + 1;
              iVar27 = 1;
              piVar26 = piVar7;
              if (piVar7 == (int *)0x0) {
                piVar26 = (int *)(lVar11 + lVar18 * 4);
                piVar7 = piVar26;
              }
            }
            else {
              if (bVar19 == 0) goto LAB_00344326;
              if (piVar26 != (int *)0x0) break;
              if (bVar19 < 4) {
                iVar27 = *(int *)(lVar11 + lVar18 * 4);
              }
              else {
                iVar27 = 1;
              }
              piVar26 = (int *)0x0;
            }
            iVar25 = iVar25 + iVar27;
          } while (iVar25 < iVar20);
          uVar31 = (uint)(uVar31 == 1);
        }
        else {
          piVar7 = (int *)0x0;
        }
        uVar4 = Wlc_ObjAlloc(p,7,iVar24,local_68[0],local_84);
        lVar11 = *(long *)((long)pData + 0x10);
        iVar24 = *(int *)(lVar11 + lVar22 * 4) + iVar17;
        bVar32 = true;
        if (iVar23 < iVar24) {
          do {
            lVar18 = (long)iVar23;
            bVar19 = *(byte *)(*(long *)((long)pData + 8) + lVar18);
            if (bVar19 == 5) {
              bVar32 = *(int *)(lVar11 + lVar18 * 4) == -1;
              break;
            }
            if (bVar19 == 0) goto LAB_00344326;
            iVar20 = 1;
            if (bVar19 < 4) {
              iVar20 = *(int *)(lVar11 + lVar18 * 4);
            }
            iVar23 = iVar23 + iVar20;
          } while (iVar23 < iVar24);
        }
        if (((byte)uVar31 & bVar32) == 0) {
          __assert_fail("nArray == 1 && NameId == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcNdr.c"
                        ,0x1bf,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
        }
        if (((int)uVar4 < 1) || (p->nObjsAlloc <= (int)uVar4)) goto LAB_00344345;
        iVar23 = *piVar7;
        piVar7 = local_78->pArray;
        pWVar2 = p->pObjs;
        if (local_78->nCap < 1) {
          if (piVar7 == (int *)0x0) {
            piVar7 = (int *)malloc(4);
          }
          else {
            piVar7 = (int *)realloc(piVar7,4);
          }
          local_78->pArray = piVar7;
          if (piVar7 == (int *)0x0) goto LAB_00343eb4;
          local_78->nCap = 1;
        }
        *piVar7 = iVar23;
        local_78->nSize = 1;
        Wlc_ObjAddFanins(p,pWVar2 + uVar4,local_78);
        Wlc_ObjSetCo(p,pWVar2 + uVar4,0);
        lVar18 = *(long *)((long)pData + 8);
        bVar19 = *(byte *)(lVar18 + lVar22);
      }
      else if (bVar19 == 0) {
LAB_00344326:
        __assert_fail("p->pHead[i]",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/miniaig/ndr.h"
                      ,0x7e,"int Ndr_DataType(Ndr_Data_t *, int)");
      }
      if (bVar19 == 0) goto LAB_00344326;
      lVar11 = *(long *)((long)pData + 0x10);
      iVar23 = 1;
      if (bVar19 < 4) {
LAB_00343e23:
        iVar23 = *(int *)(lVar11 + lVar22 * 4);
      }
      iVar17 = iVar17 + iVar23;
    } while (iVar17 < *(int *)(lVar11 + 8) + 2);
  }
LAB_00343e3e:
  if (local_78->pArray != (int *)0x0) {
    free(local_78->pArray);
  }
  free(local_78);
  uVar31 = (p->vNameIds).nSize;
  uVar12 = (ulong)uVar31;
  if (uVar12 == 0) {
    pvVar10 = (void *)0x0;
    uVar4 = 0;
  }
  else {
    piVar7 = (p->vNameIds).pArray;
    iVar17 = *piVar7;
    if (1 < (int)uVar31) {
      uVar9 = 1;
      do {
        if (iVar17 <= piVar7[uVar9]) {
          iVar17 = piVar7[uVar9];
        }
        uVar9 = uVar9 + 1;
      } while (uVar12 != uVar9);
    }
    uVar4 = iVar17 + 1;
    if (iVar17 < 0) {
      pvVar10 = (void *)0x0;
    }
    else {
      pvVar10 = calloc(1,(ulong)uVar4 << 2);
      if (pvVar10 == (void *)0x0) {
LAB_00343eb4:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
    }
    if (0 < (int)uVar31) {
      uVar9 = 0;
      do {
        uVar31 = piVar7[uVar9];
        if ((ulong)uVar31 != 0) {
          if (((int)uVar31 < 0) || (iVar17 < (int)uVar31)) {
LAB_00344364:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          *(int *)((long)pvVar10 + (ulong)uVar31 * 4) = (int)uVar9;
        }
        uVar9 = uVar9 + 1;
      } while (uVar12 != uVar9);
    }
  }
  iVar17 = p->iObj;
  if (1 < iVar17) {
    lVar11 = 1;
    do {
      if (p->nObjsAlloc <= lVar11) goto LAB_00344345;
      pWVar2 = p->pObjs + lVar11;
      if ((pWVar2->nFanins < 3) && ((*(uint *)pWVar2 & 0x3f | 0x10) != 0x16)) {
        paVar8 = &pWVar2->field_10;
      }
      else {
        paVar8 = (anon_union_8_2_cb25d913_for_Wlc_Obj_t__10 *)(pWVar2->field_10).pFanins[0];
      }
      if (0 < (int)pWVar2->nFanins) {
        lVar18 = 0;
        do {
          iVar17 = paVar8->Fanins[lVar18];
          if (((long)iVar17 < 0) || ((int)uVar4 <= iVar17)) goto LAB_00344307;
          paVar8->Fanins[lVar18] = *(int *)((long)pvVar10 + (long)iVar17 * 4);
          lVar18 = lVar18 + 1;
        } while (lVar18 < (int)pWVar2->nFanins);
        iVar17 = p->iObj;
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < iVar17);
  }
  pVVar6 = p->vInits;
  if (pVVar6 != (Vec_Int_t *)0x0) {
    uVar31 = (p->vFfs).nSize;
    uVar12 = (ulong)uVar31;
    if (0 < (int)uVar31) {
      piVar7 = (p->vFfs).pArray;
      lVar11 = 0;
      do {
        iVar17 = piVar7[lVar11];
        if (((long)iVar17 < 0) || ((int)uVar4 <= iVar17)) goto LAB_00344307;
        piVar7[lVar11] = *(int *)((long)pvVar10 + (long)iVar17 * 4);
        lVar11 = lVar11 + 1;
        uVar12 = (ulong)(p->vFfs).nSize;
      } while (lVar11 < (long)uVar12);
    }
    iVar17 = pVVar6->nSize;
    if (0 < iVar17) {
      piVar7 = pVVar6->pArray;
      lVar11 = 0;
      do {
        iVar23 = piVar7[lVar11];
        if (0 < (long)iVar23) {
          if ((int)uVar4 <= iVar23) goto LAB_00344307;
          piVar7[lVar11] = *(int *)((long)pvVar10 + (long)iVar23 * 4);
          iVar17 = pVVar6->nSize;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < iVar17);
      uVar12 = (ulong)(uint)(p->vFfs).nSize;
    }
    if ((uVar12 & 1) != 0) {
      __assert_fail("(Vec_IntSize(&pNtk->vFfs) & 1) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcNdr.c"
                    ,0x1d6,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
    }
    if ((int)uVar12 != iVar17 * 2) {
      __assert_fail("Vec_IntSize(&pNtk->vFfs) == 2 * Vec_IntSize(pNtk->vInits)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcNdr.c"
                    ,0x1d7,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
    }
    if (0 < (int)uVar12) {
      uVar9 = 0;
      do {
        lVar11 = (long)(int)uVar12;
        if (lVar11 <= (long)uVar9) goto LAB_00344307;
        iVar17 = (p->vFfs).pArray[uVar9];
        if (((long)iVar17 < 1) || (p->nObjsAlloc <= iVar17)) goto LAB_00344345;
        if ((uVar9 & 1) != 0) {
          Wlc_ObjSetCo(p,p->pObjs + iVar17,1);
          uVar31 = (p->vFfs).nSize;
          uVar12 = (ulong)uVar31;
          lVar11 = (long)(int)uVar31;
        }
        uVar9 = uVar9 + 1;
      } while ((long)uVar9 < lVar11);
    }
    (p->vFfs).nSize = 0;
    pcVar13 = Wlc_PrsConvertInitValues(p);
    p->pInits = pcVar13;
  }
  if (pvVar10 != (void *)0x0) {
    free(pvVar10);
  }
  uVar31 = (p->vNameIds).nSize;
  if ((ulong)uVar31 == 0) {
    uVar31 = 1;
LAB_00344188:
    pAVar14 = Abc_NamStart(uVar31,10);
    p->pManName = pAVar14;
  }
  else {
    puVar3 = (uint *)(p->vNameIds).pArray;
    uVar4 = *puVar3;
    if (1 < (int)uVar31) {
      uVar12 = 1;
      do {
        uVar21 = puVar3[uVar12];
        if ((int)uVar4 <= (int)uVar21) {
          uVar4 = uVar21;
        }
        uVar12 = uVar12 + 1;
      } while (uVar31 != uVar12);
    }
    uVar31 = uVar4 + 1;
    if (uVar31 < 2) goto LAB_00344188;
    uVar21 = 0;
    uVar12 = (ulong)uVar4;
    do {
      uVar5 = (uint)uVar12;
      uVar12 = uVar12 / 10;
      uVar21 = uVar21 + 1;
    } while (9 < uVar5);
    pAVar14 = Abc_NamStart(uVar31,10);
    p->pManName = pAVar14;
    if (0 < (int)uVar4) {
      uVar31 = 1;
      do {
        sprintf((char *)local_68,"s%0*d",(ulong)uVar21,(ulong)uVar31);
        uVar5 = Abc_NamStrFindOrAdd(p->pManName,(char *)local_68,&local_84);
        if ((local_84 != 0) || (uVar31 != uVar5)) {
          __assert_fail("!fFound && i == NameId",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcNdr.c"
                        ,0x1ec,"Wlc_Ntk_t *Wlc_NtkFromNdr(void *)");
        }
        bVar32 = uVar31 != uVar4;
        uVar31 = uVar31 + 1;
      } while (bVar32);
    }
  }
  pWVar15 = Wlc_NtkDupDfs(p,0,1);
  Wlc_NtkFree(p);
  if (local_98 == (uint *)0x0) goto LAB_003442e4;
  uVar31 = pWVar15->iObj;
  pVVar16 = (Vec_Wrd_t *)malloc(0x10);
  uVar4 = 0x10;
  if (0xe < uVar31 - 1) {
    uVar4 = uVar31;
  }
  pVVar16->nCap = uVar4;
  if (uVar4 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)(int)uVar4 << 3);
  }
  pVVar16->pArray = __s;
  pVVar16->nSize = uVar31;
  memset(__s,0,(long)(int)uVar31 * 8);
  pWVar15->vLutTruths = pVVar16;
  if ((int)uVar31 < 2) {
    pvVar10 = *(void **)(local_98 + 2);
    if (pvVar10 != (void *)0x0) goto LAB_003442d2;
  }
  else {
    uVar12 = 1;
    if (1 < pWVar15->nObjsAlloc) {
      uVar12 = (ulong)(uint)pWVar15->nObjsAlloc;
    }
    uVar9 = 1;
    lVar11 = 3;
    do {
      if (uVar12 == uVar9) {
LAB_00344345:
        __assert_fail("Id > 0 && Id < p->nObjsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlc.h"
                      ,0x11a,"Wlc_Obj_t *Wlc_NtkObj(Wlc_Ntk_t *, int)");
      }
      if ((long)(pWVar15->vNameIds).nSize <= (long)uVar9) {
LAB_00344307:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar17 = (pWVar15->vNameIds).pArray[uVar9];
      if (((long)iVar17 < 0) || ((int)local_98[1] <= iVar17)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                      ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
      }
      pvVar10 = *(void **)(local_98 + 2);
      if ((iVar17 != 0) && ((*(ushort *)(&pWVar15->pObjs->field_0x0 + lVar11 * 8) & 0x3f) == 0x3b))
      {
        if ((long)(int)uVar31 <= (long)uVar9) {
LAB_003443c1:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
        }
        __s[uVar9] = *(word *)((long)pvVar10 + (long)iVar17 * 8);
      }
      uVar9 = uVar9 + 1;
      lVar11 = lVar11 + 3;
    } while (uVar31 != uVar9);
LAB_003442d2:
    free(pvVar10);
  }
  free(local_98);
LAB_003442e4:
  pWVar15->fMemPorts = 1;
  pWVar15->fEasyFfs = 1;
  return pWVar15;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkFromNdr( void * pData )
{
    Ndr_Data_t * p = (Ndr_Data_t *)pData;  
    Wlc_Obj_t * pObj; Vec_Int_t * vName2Obj, * vFanins = Vec_IntAlloc( 100 );
    int Mod = 2, i, k, Obj, * pArray, nDigits, fFound, NameId, NameIdMax;
    Vec_Wrd_t * vTruths = NULL;
    Wlc_Ntk_t * pTemp, * pNtk = Wlc_NtkAlloc( "top", Ndr_DataObjNum(p, Mod)+1 );
    Wlc_NtkCheckIntegrity( pData );
    Vec_IntClear( &pNtk->vFfs );
    //pNtk->pSpec = Abc_UtilStrsav( pFileName );
    // construct network and save name IDs
    Wlc_NtkCleanNameId( pNtk );
    Ndr_ModForEachPi( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjReadRange(p, Obj, &End, &Beg);
        int iObj = Wlc_ObjAlloc( pNtk, WLC_OBJ_PI, Signed, End, Beg );
        int NameId = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        Wlc_ObjSetNameId( pNtk, iObj, NameId );
    }
    Ndr_ModForEachNode( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjReadRange(p, Obj, &End, &Beg);
        int Type    = Ndr_ObjReadBody( p, Obj, NDR_OPERTYPE );
        int nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        Vec_Int_t F = {nArray, nArray, pArray}, * vTemp = &F;
        int iObj    = Wlc_ObjAlloc( pNtk, Ndr_TypeNdr2Wlc(Type), Signed, End, Beg );
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        Vec_IntClear( vFanins );
        Vec_IntAppend( vFanins, vTemp );
        if ( Type == ABC_OPER_DFF )
        {
            // save init state
            if ( pNtk->vInits == NULL )
                pNtk->vInits = Vec_IntAlloc( 100 );
            if ( Vec_IntSize(vFanins) == 2 )
                Vec_IntPush( pNtk->vInits, Vec_IntPop(vFanins) );
            else // assume const0 if init is not given
                Vec_IntPush( pNtk->vInits, -(End-Beg+1) );
            // save flop output
            pObj = Wlc_NtkObj(pNtk, iObj);
            assert( Wlc_ObjType(pObj) == WLC_OBJ_FO );
            Wlc_ObjSetNameId( pNtk, iObj, NameId );
            Vec_IntPush( &pNtk->vFfs, NameId );
            // save flop input
            assert( Vec_IntSize(vFanins) == 1 );
            Vec_IntPush( &pNtk->vFfs, Vec_IntEntry(vFanins, 0) );
            continue;
        }
        if ( Type == ABC_OPER_DFFRSE )
            Vec_IntPush( &pNtk->vFfs2, iObj );
        if ( Type == ABC_OPER_LUT )
        {
            if ( vTruths == NULL )
                vTruths = Vec_WrdStart( 1000 );
            if ( NameId >= Vec_WrdSize(vTruths) )
                Vec_WrdFillExtra( vTruths, 2*NameId, 0 );
            Vec_WrdWriteEntry( vTruths, NameId, *((word *)Ndr_ObjReadBodyP(p, Obj, NDR_FUNCTION)) );
        }
        if ( Type == ABC_OPER_SLICE )
            Vec_IntPushTwo( vFanins, End, Beg );
        else if ( Type == ABC_OPER_CONST )
            Ndr_ObjReadConstant( vFanins, (char *)Ndr_ObjReadBodyP(p, Obj, NDR_FUNCTION) );
        else if ( Type == ABC_OPER_BIT_MUX && Vec_IntSize(vFanins) == 3 )
            ABC_SWAP( int, Vec_IntEntryP(vFanins, 1)[0], Vec_IntEntryP(vFanins, 2)[0] );
        Wlc_ObjAddFanins( pNtk, Wlc_NtkObj(pNtk, iObj), vFanins );
        Wlc_ObjSetNameId( pNtk, iObj, NameId );
        if ( Type == ABC_OPER_ARI_SMUL )
        {
            pObj = Wlc_NtkObj(pNtk, iObj);
            assert( Wlc_ObjFaninNum(pObj) == 2 );
            Wlc_ObjFanin0(pNtk, pObj)->Signed = 1;
            Wlc_ObjFanin1(pNtk, pObj)->Signed = 1;
        }
    }
    // mark primary outputs
    Ndr_ModForEachPo( p, Mod, Obj )
    {
        int End, Beg, Signed = Ndr_ObjReadRange(p, Obj, &End, &Beg);
        int nArray  = Ndr_ObjReadArray( p, Obj, NDR_INPUT, &pArray );
        int iObj    = Wlc_ObjAlloc( pNtk, WLC_OBJ_BUF, Signed, End, Beg );
        int NameId  = Ndr_ObjReadBody( p, Obj, NDR_OUTPUT );
        assert( nArray == 1 && NameId == -1 );
        pObj = Wlc_NtkObj( pNtk, iObj );
        Vec_IntFill( vFanins, 1, pArray[0] );
        Wlc_ObjAddFanins( pNtk, pObj, vFanins );
        Wlc_ObjSetCo( pNtk, pObj, 0 );
    }
    Vec_IntFree( vFanins );
    // map name IDs into object IDs
    vName2Obj = Vec_IntInvert( &pNtk->vNameIds, 0 );
    Wlc_NtkForEachObj( pNtk, pObj, i )
    {
        int * pFanins = Wlc_ObjFanins(pObj);
        for ( k = 0; k < Wlc_ObjFaninNum(pObj); k++ )
            pFanins[k] = Vec_IntEntry(vName2Obj, pFanins[k]);
    }
    if ( pNtk->vInits )
    {
        Vec_IntForEachEntry( &pNtk->vFfs, NameId, i )
            Vec_IntWriteEntry( &pNtk->vFfs, i, Vec_IntEntry(vName2Obj, NameId) );
        Vec_IntForEachEntry( pNtk->vInits, NameId, i )
            if ( NameId > 0 )
                Vec_IntWriteEntry( pNtk->vInits, i, Vec_IntEntry(vName2Obj, NameId) );
        // move FO/FI to be part of CI/CO
        assert( (Vec_IntSize(&pNtk->vFfs) & 1) == 0 );
        assert( Vec_IntSize(&pNtk->vFfs) == 2 * Vec_IntSize(pNtk->vInits) );
        Wlc_NtkForEachFf( pNtk, pObj, i )
            if ( i & 1 )
                Wlc_ObjSetCo( pNtk, pObj, 1 );
            //else
            //    Wlc_ObjSetCi( pNtk, pObj );
        Vec_IntClear( &pNtk->vFfs );
        // convert init values into binary string
        //Vec_IntPrint( &p->pNtk->vInits );
        pNtk->pInits = Wlc_PrsConvertInitValues( pNtk );
        //printf( "%s", p->pNtk->pInits );
    }
    Vec_IntFree(vName2Obj);
    // create fake object names
    NameIdMax = Vec_IntFindMax(&pNtk->vNameIds);
    nDigits = Abc_Base10Log( NameIdMax+1 );
    pNtk->pManName = Abc_NamStart( NameIdMax+1, 10 );
    for ( i = 1; i <= NameIdMax; i++ )
    {
        char pName[20]; sprintf( pName, "s%0*d", nDigits, i );
        NameId = Abc_NamStrFindOrAdd( pNtk->pManName, pName, &fFound );
        assert( !fFound && i == NameId );
    }
    //Ndr_NtkPrintNodes( pNtk );
    //Wlc_WriteVer( pNtk, "temp_ndr.v", 0, 0 );
    // derive topological order
    pNtk = Wlc_NtkDupDfs( pTemp = pNtk, 0, 1 );
    Wlc_NtkFree( pTemp );
    // copy truth tables
    if ( vTruths )
    {
        pNtk->vLutTruths = Vec_WrdStart( Wlc_NtkObjNumMax(pNtk) );
        Wlc_NtkForEachObj( pNtk, pObj, i )
        {
            int iObj   = Wlc_ObjId(pNtk, pObj);
            int NameId = Wlc_ObjNameId(pNtk, iObj);
            word Truth = Vec_WrdEntry(vTruths, NameId);
            if ( pObj->Type != WLC_OBJ_LUT || NameId == 0 )
                continue;
            assert( sizeof(void *) == 8 || Wlc_ObjFaninNum(pObj) < 6 );
            Vec_WrdWriteEntry( pNtk->vLutTruths, iObj, Truth );
        }
        Vec_WrdFreeP( &vTruths );
    }
    //Ndr_NtkPrintNodes( pNtk );
    pNtk->fMemPorts = 1;          // the network contains memory ports
    pNtk->fEasyFfs = 1;           // the network contains simple flops
    return pNtk;
}